

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool matchit::impl::
     PatternTraits<matchit::impl::Or<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>,matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>>
     ::
     matchPatternImpl<mathiu::impl::Power_const&,matchit::impl::Context<bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::Power_const*,bool,bool,mathiu::impl::Log_const*,bool,bool,mathiu::impl::Sin_const*,bool,bool,mathiu::impl::Arctan_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
               (Power *value,
               Or<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *orPat,int32_t depth,
               Context<bool,_const_mathiu::impl::Sum_*,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::Power_*,_bool,_bool,_const_mathiu::impl::Log_*,_bool,_bool,_const_mathiu::impl::Sin_*,_bool,_bool,_const_mathiu::impl::Arctan_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
               *context)

{
  bool bVar1;
  
  bVar1 = mathiu::impl::equal((ExprPtr *)
                              &(orPat->mPatterns).
                               super__Tuple_impl<0UL,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                               .
                               super__Head_base<0UL,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_false>
                              ,(ExprPtr *)value);
  if (bVar1) {
    return true;
  }
  bVar1 = mathiu::impl::equal((ExprPtr *)orPat,(value->super_ExprPtrArray<2>)._M_elems + 1);
  return bVar1;
}

Assistant:

constexpr static auto matchPatternImpl(Value &&value,
                                                   Or<Patterns...> const &orPat,
                                                   int32_t depth, ContextT &context)
            {
                constexpr auto patSize = sizeof...(Patterns);
                return std::apply(
                           [&value, depth, &context](auto const &...patterns)
                           {
                               return (matchPattern(value, patterns, depth + 1, context) ||
                                       ...);
                           },
                           take<patSize - 1>(orPat.patterns())) ||
                       matchPattern(std::forward<Value>(value),
                                    get<patSize - 1>(orPat.patterns()), depth + 1, context);
            }